

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0> *
__thiscall
cpptrace::detail::libdwarf::die_object::get_string_attribute_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *__return_storage_ptr__,die_object *this,Dwarf_Half attr_num)

{
  Dwarf_Signed *pDVar1;
  int iVar2;
  char *raw_str;
  Dwarf_Attribute attr;
  raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O3__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0,_0,_0>
  strwrapper;
  char *in_stack_ffffffffffffff88;
  _Alloc_hider local_70;
  size_type local_68;
  undefined1 local_60 [16];
  char *local_50;
  Dwarf_Attribute local_48;
  raii_wrapper<char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O3__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0,_0,_0>
  local_40;
  Dwarf_Attribute local_28;
  undefined1 local_1f;
  
  local_70._M_p = (pointer)0x0;
  iVar2 = dwarf_attr(this->die,attr_num,&local_48,(Dwarf_Error *)&local_70);
  if (iVar2 == 1) {
    handle_dwarf_error(this->dbg,(Dwarf_Error)local_70._M_p);
  }
  if (iVar2 == 0) {
    local_28 = local_48;
    local_1f = 1;
    local_70._M_p = (pointer)0x0;
    iVar2 = dwarf_formstring(local_48,&local_50,(Dwarf_Error *)&local_70);
    if (iVar2 == 1) {
      handle_dwarf_error(this->dbg,(Dwarf_Error)local_70._M_p);
    }
    if (iVar2 != 0) {
      assert_fail((detail *)0x1,0x1d272d,
                  "optional<std::string> cpptrace::detail::libdwarf::die_object::get_string_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0x95),in_stack_ffffffffffffff88);
    }
    local_40.obj = local_50;
    local_40.deleter.holds_value = true;
    local_40.deleter.field_0 =
         (anon_union_8_2_d41c7fdf_for_optional<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O3__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:150:54),_0>_2
          )this;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,local_50,(allocator<char> *)&stack0xffffffffffffff8f);
    __return_storage_ptr__->holds_value = true;
    pDVar1 = (Dwarf_Signed *)((long)&__return_storage_ptr__->field_0 + 0x10);
    *(Dwarf_Signed **)&__return_storage_ptr__->field_0 = pDVar1;
    if ((Dwarf_Error)local_70._M_p == (Dwarf_Error)local_60) {
      *pDVar1 = local_60._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x18) = local_60._8_8_;
    }
    else {
      (__return_storage_ptr__->field_0).uvalue._M_dataplus._M_p = local_70._M_p;
      *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = local_60._0_8_;
    }
    (__return_storage_ptr__->field_0).uvalue._M_string_length = local_68;
    raii_wrapper<char_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:150:54),_0,_0,_0>
    ::~raii_wrapper(&local_40);
    dwarf_dealloc_attribute(local_48);
  }
  else {
    __return_storage_ptr__->holds_value = false;
  }
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> get_string_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            if(wrap(dwarf_attr, die, attr_num, &attr) == DW_DLV_OK) {
                auto attwrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
                char* raw_str;
                VERIFY(wrap(dwarf_formstring, attr, &raw_str) == DW_DLV_OK);
                auto strwrapper = raii_wrap(raw_str, [this] (char* str) { dwarf_dealloc(dbg, str, DW_DLA_STRING); });
                std::string str = raw_str;
                return str;
            } else {
                return nullopt;
            }
        }